

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O0

int fl_draw_symbol(char *label,int x,int y,int w,int h,Fl_Color col)

{
  char cVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  uint w_00;
  char *pcVar5;
  int local_4c;
  int pos;
  int rotangle;
  char flip_y;
  char flip_x;
  int n_1;
  int n;
  int equalscale;
  char *p;
  uint local_28;
  Fl_Color col_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  char *label_local;
  
  _n = label + 1;
  if (*label == '@') {
    fl_init_symbols();
    cVar1 = *_n;
    if (cVar1 == '#') {
      _n = label + 2;
    }
    if (((*_n == '-') && ('0' < _n[1])) && (_n[1] < ':')) {
      iVar4 = _n[1] + -0x30;
      w_local = iVar4 + x;
      h_local = iVar4 + y;
      col_local = w + iVar4 * -2;
      local_28 = h + iVar4 * -2;
      _n = _n + 2;
    }
    else {
      local_28 = h;
      col_local = w;
      h_local = y;
      w_local = x;
      if (((*_n == '+') && ('0' < _n[1])) && (_n[1] < ':')) {
        iVar4 = _n[1] + -0x30;
        w_local = x - iVar4;
        h_local = y - iVar4;
        col_local = iVar4 * 2 + w;
        local_28 = iVar4 * 2 + h;
        _n = _n + 2;
      }
    }
    if ((int)col_local < 10) {
      w_local = w_local - (int)(10 - col_local) / 2;
      col_local = 10;
    }
    if ((int)local_28 < 10) {
      h_local = h_local - (int)(10 - local_28) / 2;
      local_28 = 10;
    }
    w_00 = col_local - 1 | 1;
    local_28 = local_28 - 1 | 1;
    cVar2 = *_n;
    if (cVar2 == '$') {
      _n = _n + 1;
    }
    cVar3 = *_n;
    if (cVar3 == '%') {
      _n = _n + 1;
    }
    pcVar5 = _n + 1;
    switch(*_n) {
    case '0':
      local_4c = (_n[2] + -0x30) * 1000 + (_n[3] + -0x30) * 100 + (_n[4] + -0x30) * 10;
      _n = _n + 5;
      break;
    case '1':
      local_4c = 0x8ca;
      _n = pcVar5;
      break;
    case '2':
      local_4c = 0xa8c;
      _n = pcVar5;
      break;
    case '3':
      local_4c = 0xc4e;
      _n = pcVar5;
      break;
    case '4':
      local_4c = 0x708;
      _n = pcVar5;
      break;
    case '5':
    case '6':
      local_4c = 0;
      _n = pcVar5;
      break;
    case '7':
      local_4c = 0x546;
      _n = pcVar5;
      break;
    case '8':
      local_4c = 900;
      _n = pcVar5;
      break;
    case '9':
      local_4c = 0x1c2;
      _n = pcVar5;
      break;
    default:
      local_4c = 0;
    }
    iVar4 = find(_n);
    if (symbols[iVar4].notempty == '\0') {
      label_local._4_4_ = 0;
    }
    else if (symbols[iVar4].scalable == '\x03') {
      fl_return_arrow(w_local,h_local,w_00,local_28);
      label_local._4_4_ = 1;
    }
    else {
      fl_push_matrix();
      fl_translate((double)(w_local + (int)w_00 / 2),(double)(h_local + (int)local_28 / 2));
      if (symbols[iVar4].scalable != '\0') {
        col_local = w_00;
        if ((cVar1 == '#') && (col_local = local_28, (int)w_00 < (int)local_28)) {
          local_28 = w_00;
          col_local = w_00;
        }
        fl_scale((double)(int)col_local * 0.5,(double)(int)local_28 * 0.5);
        fl_rotate((double)local_4c / 10.0);
        if (cVar2 == '$') {
          fl_scale(-1.0,1.0);
        }
        if (cVar3 == '%') {
          fl_scale(1.0,-1.0);
        }
      }
      (*symbols[iVar4].drawit)(col);
      fl_pop_matrix();
      label_local._4_4_ = 1;
    }
  }
  else {
    label_local._4_4_ = 0;
  }
  return label_local._4_4_;
}

Assistant:

int fl_draw_symbol(const char *label,int x,int y,int w,int h,Fl_Color col) {  
  const char *p = label;
  if (*p++ != '@') return 0;
  fl_init_symbols();
  int equalscale = 0;
  if (*p == '#') {equalscale = 1; p++;}
  if (*p == '-' && p[1]>='1' && p[1]<='9') {
    int n = p[1]-'0';
    x += n; y += n; w -= 2*n; h -= 2*n;
    p += 2;
  } else if (*p == '+' && p[1]>='1' && p[1]<='9') {
    int n = p[1]-'0';
    x -= n; y -= n; w += 2*n; h += 2*n;
    p += 2;
  }
  if (w < 10) {x -= (10-w)/2; w = 10;}
  if (h < 10) {y -= (10-h)/2; h = 10;}
  w = (w-1)|1; h = (h-1)|1;
  char flip_x = 0, flip_y = 0;
  if (*p=='$') {
    flip_x = 1;
    p++;
  }
  if (*p=='%') {
    flip_y = 1;
    p++;
  }
  int rotangle;
  switch (*p++) {
  case '0':
    rotangle = 1000*(p[1]-'0') + 100*(p[2]-'0') + 10*(p[3]-'0');
    p += 4;
    break;
  case '1': rotangle = 2250; break;
  case '2': rotangle = 2700; break;
  case '3': rotangle = 3150; break;
  case '4': rotangle = 1800; break;
  case '5':
  case '6': rotangle = 0; break;
  case '7': rotangle = 1350; break;
  case '8': rotangle =  900; break;
  case '9': rotangle =  450; break;
  default: rotangle = 0; p--; break;
  }
  int pos = find(p);
  if (!symbols[pos].notempty) return 0;
  if (symbols[pos].scalable == 3) { // kludge to detect return arrow
    fl_return_arrow(x,y,w,h);
    return 1;
  }
  fl_push_matrix();
  fl_translate(x+w/2,y+h/2);
  if (symbols[pos].scalable) {
    if (equalscale) {if (w<h) h = w; else w = h;}
    fl_scale(0.5*w, 0.5*h);
    fl_rotate(rotangle/10.0);
    if (flip_x) fl_scale(-1.0, 1.0);
    if (flip_y) fl_scale(1.0, -1.0);
  }
  (symbols[pos].drawit)(col);
  fl_pop_matrix();
  return 1;
}